

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memenv.cc
# Opt level: O2

Status __thiscall
leveldb::anon_unknown_2::WritableFileImpl::Append(WritableFileImpl *this,Slice *data)

{
  size_t sVar1;
  undefined8 *in_RDX;
  ulong __n;
  ulong uVar2;
  ulong uVar3;
  void *__src;
  long in_FS_OFFSET;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  sVar1 = data->size_;
  __src = (void *)*in_RDX;
  uVar3 = in_RDX[1];
  std::mutex::lock((mutex *)&((pthread_mutex_t *)(sVar1 + 0x30))->__data);
  for (; uVar3 != 0; uVar3 = uVar3 - __n) {
    uVar2 = *(ulong *)(sVar1 + 0x70) & 0x1fff;
    if (uVar2 == 0) {
      local_40 = (char *)operator_new__(0x2000);
      std::vector<char*,std::allocator<char*>>::emplace_back<char*>
                ((vector<char*,std::allocator<char*>> *)(sVar1 + 0x58),&local_40);
      __n = 0x2000;
    }
    else {
      __n = 0x2000 - uVar2;
    }
    if (uVar3 <= __n) {
      __n = uVar3;
    }
    memcpy((void *)(uVar2 + *(long *)(*(long *)(sVar1 + 0x60) + -8)),__src,__n);
    __src = (void *)((long)__src + __n);
    *(long *)(sVar1 + 0x70) = *(long *)(sVar1 + 0x70) + __n;
  }
  (this->super_WritableFile)._vptr_WritableFile = (_func_int **)0x0;
  pthread_mutex_unlock((pthread_mutex_t *)(sVar1 + 0x30));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status Append(const Slice& data) override { return file_->Append(data); }